

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O3

void dumpDictKeys(object *dict)

{
  ulong *puVar1;
  ulong uVar2;
  uint *puVar3;
  char *templ;
  int line_num;
  ulong uVar4;
  
  if (dict == (object *)0x0) {
    templ = "Null dictionary oop passed!";
    line_num = 0x76;
  }
  else {
    puVar1 = (ulong *)dict[1].header;
    if (puVar1 != (ulong *)0x0) {
      uVar2 = *puVar1;
      if ((uVar2 & 0xfffffffc) != 0) {
        uVar4 = 0;
        do {
          puVar3 = (uint *)puVar1[uVar4 + 2];
          if (puVar3 != (uint *)0x0) {
            printf("%.*s ",(ulong)(*puVar3 >> 2),puVar3 + 4);
          }
          uVar4 = uVar4 + 1;
        } while ((uVar2 >> 2 & 0x3fffffff) != uVar4);
      }
      return;
    }
    templ = "Dictionary does not have any keys!";
    line_num = 0x7c;
  }
  info_impl("dumpDictKeys",line_num,templ);
  return;
}

Assistant:

void dumpDictKeys(struct object *dict)
{
    struct object *keys;
    struct object *key;
    int numKeys = 0;

    if(!dict) {
        info("Null dictionary oop passed!");
        return;
    }

    keys = dict->data[keysInDictionary];
    if(!keys) {
        info("Dictionary does not have any keys!");
        return;
    }

    numKeys = SIZE(keys);

    for(int i=0; i<numKeys; i++) {
        struct byteObject *key = (struct byteObject *)keys->data[i];

        if(key) {
            printf("%.*s ", SIZE(key), bytePtr(key));
        }
    }
}